

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkForce.cpp
# Opt level: O1

double __thiscall chrono::ChLinkForce::GetForce(ChLinkForce *this,double x,double x_dt,double t)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  if (this->m_active == true) {
    dVar1 = this->m_F;
    (*((this->m_F_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_ChFunction[4])();
    dVar2 = this->m_K;
    dVar5 = x;
    (*((this->m_K_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_ChFunction[4])();
    auVar9._8_8_ = 0;
    auVar9._0_8_ = t;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar1;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar5 * dVar2 * x;
    auVar3 = vfmsub231sd_fma(auVar7,auVar9,auVar3);
    dVar1 = this->m_R;
    (*((this->m_R_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_ChFunction[4])();
    auVar6._8_8_ = 0;
    auVar6._0_8_ = x_dt;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = auVar3._0_8_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = x * dVar1;
    auVar3 = vfnmadd213sd_fma(auVar6,auVar8,auVar4);
    return auVar3._0_8_;
  }
  return 0.0;
}

Assistant:

double ChLinkForce::GetForce(double x, double x_dt, double t) const {
    if (!m_active)
        return 0;
    return m_F * m_F_modul->Get_y(t) - (m_K * m_K_modul->Get_y(x)) * x - (m_R * m_R_modul->Get_y(x)) * x_dt;
}